

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

uint8_t * google::protobuf::internal::SerializeMapKeyWithCachedSizes
                    (FieldDescriptor *field,MapKey *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  string_view s;
  EpsCopyOutputStream *this;
  ptrdiff_t pVar2;
  bool bVar3;
  Type TVar4;
  uint32_t uVar5;
  int32_t iVar6;
  int iVar7;
  LogMessage *pLVar8;
  uint64_t uVar9;
  int64_t iVar10;
  const_pointer __src;
  byte *__dest;
  string_view local_b0 [2];
  LogMessage local_90;
  Voidify local_79;
  EpsCopyOutputStream *local_78;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MapKey *value_local;
  FieldDescriptor *field_local;
  char *local_50;
  size_type local_48;
  ptrdiff_t size;
  basic_string_view<char,_std::char_traits<char>_> *local_38;
  uint32_t local_2c;
  EpsCopyOutputStream *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  local_78 = stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)value;
  value_local = (MapKey *)field;
  stream_local = (EpsCopyOutputStream *)io::EpsCopyOutputStream::EnsureSpace(stream,target);
  TVar4 = FieldDescriptor::type((FieldDescriptor *)value_local);
  this = local_78;
  switch(TVar4) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x42b);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
    pLVar8 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar8,(char (*) [12])"Unsupported");
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar8);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_90);
  case TYPE_INT64:
    iVar10 = MapKey::GetInt64Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteInt64ToArray(1,iVar10,(uint8_t *)stream_local);
    break;
  case TYPE_UINT64:
    uVar9 = MapKey::GetUInt64Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteUInt64ToArray(1,uVar9,(uint8_t *)stream_local);
    break;
  case TYPE_INT32:
    iVar6 = MapKey::GetInt32Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteInt32ToArray(1,iVar6,(uint8_t *)stream_local);
    break;
  case TYPE_FIXED64:
    uVar9 = MapKey::GetUInt64Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteFixed64ToArray(1,uVar9,(uint8_t *)stream_local);
    break;
  case TYPE_FIXED32:
    uVar5 = MapKey::GetUInt32Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteFixed32ToArray(1,uVar5,(uint8_t *)stream_local);
    break;
  case TYPE_BOOL:
    bVar3 = MapKey::GetBoolValue((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteBoolToArray(1,bVar3,(uint8_t *)stream_local);
    break;
  case TYPE_STRING:
    local_b0[0] = MapKey::GetStringValue((MapKey *)target_local);
    local_28 = this;
    local_2c = 1;
    local_38 = local_b0;
    size = (ptrdiff_t)stream_local;
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_38);
    pVar2 = size;
    bVar3 = true;
    if ((long)local_48 < 0x80) {
      puVar1 = this->end_;
      iVar7 = io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar3 = (long)(puVar1 + (-(long)iVar7 - pVar2) + 0xf) < (long)local_48;
    }
    if (bVar3) {
      field_local = (FieldDescriptor *)local_38->_M_len;
      local_50 = local_38->_M_str;
      s._M_len = local_38->_M_len;
      s._M_str = local_38->_M_str;
      local_20 = (EpsCopyOutputStream *)
                 io::EpsCopyOutputStream::WriteStringOutline(this,local_2c,s,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data(local_38);
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
    break;
  case TYPE_UINT32:
    uVar5 = MapKey::GetUInt32Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteUInt32ToArray(1,uVar5,(uint8_t *)stream_local);
    break;
  case TYPE_SFIXED32:
    iVar6 = MapKey::GetInt32Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteSFixed32ToArray(1,iVar6,(uint8_t *)stream_local);
    break;
  case TYPE_SFIXED64:
    iVar10 = MapKey::GetInt64Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteSFixed64ToArray(1,iVar10,(uint8_t *)stream_local);
    break;
  case TYPE_SINT32:
    iVar6 = MapKey::GetInt32Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteSInt32ToArray(1,iVar6,(uint8_t *)stream_local);
    break;
  case MAX_TYPE:
    iVar10 = MapKey::GetInt64Value((MapKey *)target_local);
    stream_local = (EpsCopyOutputStream *)
                   WireFormatLite::WriteSInt64ToArray(1,iVar10,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* SerializeMapKeyWithCachedSizes(const FieldDescriptor* field,
                                        const MapKey& value, uint8_t* target,
                                        io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      break;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)   \
  case FieldDescriptor::TYPE_##FieldType:                    \
    target = WireFormatLite::Write##CamelFieldType##ToArray( \
        1, value.Get##CamelCppType##Value(), target);        \
    break;
      CASE_TYPE(INT64, Int64, Int64)
      CASE_TYPE(UINT64, UInt64, UInt64)
      CASE_TYPE(INT32, Int32, Int32)
      CASE_TYPE(FIXED64, Fixed64, UInt64)
      CASE_TYPE(FIXED32, Fixed32, UInt32)
      CASE_TYPE(BOOL, Bool, Bool)
      CASE_TYPE(UINT32, UInt32, UInt32)
      CASE_TYPE(SFIXED32, SFixed32, Int32)
      CASE_TYPE(SFIXED64, SFixed64, Int64)
      CASE_TYPE(SINT32, SInt32, Int32)
      CASE_TYPE(SINT64, SInt64, Int64)
#undef CASE_TYPE
    case FieldDescriptor::TYPE_STRING:
      target = stream->WriteString(1, value.GetStringValue(), target);
      break;
  }
  return target;
}